

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

bool __thiscall spvtools::opt::AggressiveDCEPass::ProcessGlobalValues(AggressiveDCEPass *this)

{
  OperandList *this_00;
  Op OVar1;
  IRContext *pIVar2;
  pointer pOVar3;
  DefUseManager *pDVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  CommonDebugInfoInstructions CVar10;
  uint32_t uVar11;
  array<signed_char,_4UL> aVar12;
  uint32_t id;
  Instruction *pIVar13;
  ulong uVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  Operand *__x;
  byte bVar17;
  uint uVar18;
  undefined8 *puVar19;
  uint uVar20;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  __i;
  long lVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  Instruction *inst;
  Instruction *val;
  Module *pMVar24;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> annotations;
  bool local_88;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  pIVar13 = *(Instruction **)
             ((long)&(((((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_88 = false;
  do {
    while( true ) {
      if (pIVar13 == (Instruction *)0x0) goto LAB_0055c2ae;
      while (pIVar13->opcode_ != OpName) {
        pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar13 == (Instruction *)0x0) ||
           ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
        goto LAB_0055c2ae;
      }
      bVar6 = IsTargetDead(this,pIVar13);
      if (!bVar6) break;
      pIVar13 = IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar13);
      local_88 = true;
    }
    pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false);
LAB_0055c2ae:
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  local_38 = 0;
  pMVar24 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar13 = *(Instruction **)
             ((long)&(pMVar24->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar15 = (Instruction *)
            ((long)&(pMVar24->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar13 != pIVar15) {
    do {
      local_78._0_8_ = pIVar13;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 &local_48,(Instruction **)local_78);
      puVar19 = puStack_40;
      puVar23 = local_48;
      pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar13 != pIVar15);
    if (local_48 != puStack_40) {
      lVar21 = (long)puStack_40 - (long)local_48;
      uVar14 = lVar21 >> 3;
      lVar5 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                (local_48,puStack_40,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar21 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                  (puVar23,puVar19);
      }
      else {
        puVar22 = puVar23 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                  (puVar23,puVar22);
        for (; puVar22 != puVar19; puVar22 = puVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Val_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                    (puVar22);
        }
      }
    }
  }
  if (local_48 != puStack_40) {
    local_50 = puStack_40;
    puVar19 = local_48;
    puVar23 = puStack_40;
    do {
      pIVar13 = (Instruction *)*puVar19;
      OVar1 = pIVar13->opcode_;
      switch(OVar1) {
      case OpDecorate:
      case OpMemberDecorate:
        goto switchD_0055c3a8_caseD_47;
      case OpDecorationGroup:
        pIVar2 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar2);
        }
        uVar11 = analysis::DefUseManager::NumUsers
                           ((pIVar2->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl,pIVar13);
        bVar6 = uVar11 == 0;
LAB_0055c3ce:
        if (bVar6) break;
        goto LAB_0055c661;
      case OpGroupDecorate:
        if (((int)((ulong)((long)(pIVar13->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pIVar13->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 &
            0xfffffffeU) != 0) {
          uVar20 = 1;
          bVar6 = true;
          bVar8 = false;
          do {
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pDVar4 = (pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,uVar20);
            pIVar15 = analysis::DefUseManager::GetDef(pDVar4,uVar11);
            bVar7 = IsLive(this,pIVar15);
            if (bVar7) {
              uVar20 = uVar20 + 1;
              bVar6 = false;
            }
            else {
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                        (&pIVar13->operands_,
                         (pIVar13->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar20);
              bVar8 = true;
              local_88 = true;
            }
          } while (uVar20 < (uint)((int)((ulong)((long)(pIVar13->operands_).
                                                                                                              
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pIVar13->operands_).
                                                                                                            
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  -0x55555555));
LAB_0055c63d:
          puVar23 = local_50;
          if (!bVar6) {
            if ((bVar8) &&
               (pIVar2 = (this->super_MemPass).super_Pass.context_,
               (pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone)) {
              analysis::DefUseManager::UpdateDefUse
                        ((pIVar2->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,pIVar13);
            }
            goto LAB_0055c661;
          }
        }
        break;
      case OpGroupMemberDecorate:
        if (((int)((ulong)((long)(pIVar13->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pIVar13->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 &
            0xfffffffeU) != 0) {
          this_00 = &pIVar13->operands_;
          uVar20 = 1;
          bVar6 = true;
          bVar8 = false;
          do {
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pDVar4 = (pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,uVar20);
            pIVar15 = analysis::DefUseManager::GetDef(pDVar4,uVar11);
            bVar7 = IsLive(this,pIVar15);
            if (bVar7) {
              uVar20 = uVar20 + 2;
              bVar6 = false;
            }
            else {
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                        (this_00,(this_00->
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 )._M_impl.super__Vector_impl_data._M_start + (uVar20 + 1));
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                        (this_00,(this_00->
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar20);
              bVar8 = true;
              local_88 = true;
            }
          } while (uVar20 < (uint)((int)((ulong)((long)(pIVar13->operands_).
                                                                                                              
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pIVar13->operands_).
                                                                                                            
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  -0x55555555));
          goto LAB_0055c63d;
        }
        break;
      default:
        if (1 < OVar1 - OpDecorateString) {
          if (OVar1 != OpDecorateId) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                          ,0x381,"bool spvtools::opt::AggressiveDCEPass::ProcessGlobalValues()");
          }
          bVar6 = IsTargetDead(this,pIVar13);
          if (bVar6) break;
          uVar20 = (pIVar13->has_result_id_ & 1) + 1;
          if (pIVar13->has_type_id_ == false) {
            uVar20 = (uint)pIVar13->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(pIVar13,uVar20 + 1);
          if (uVar11 == 0x1602) {
            uVar20 = (pIVar13->has_result_id_ & 1) + 1;
            if (pIVar13->has_type_id_ == false) {
              uVar20 = (uint)pIVar13->has_result_id_;
            }
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,uVar20 + 2);
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pIVar15 = analysis::DefUseManager::GetDef
                                ((pIVar2->def_use_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                 ._M_head_impl,uVar11);
            bVar6 = IsLive(this,pIVar15);
            bVar6 = !bVar6;
            puVar23 = local_50;
            goto LAB_0055c3ce;
          }
          goto LAB_0055c661;
        }
switchD_0055c3a8_caseD_47:
        bVar6 = IsTargetDead(this,pIVar13);
        if (bVar6) break;
        goto LAB_0055c661;
      }
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar13);
      local_88 = true;
LAB_0055c661:
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar23);
  }
  pMVar24 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar15 = (Instruction *)
            ((long)&(pMVar24->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
            8);
  pIVar13 = *(Instruction **)
             ((long)&(pMVar24->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>
             + 0x10);
  if (pIVar13 != pIVar15) {
    do {
      bVar6 = IsLive(this,pIVar13);
      if (!bVar6) {
        CVar10 = Instruction::GetCommonDebugOpcode(pIVar13);
        if (CVar10 == CommonDebugInfoDebugGlobalVariable) {
          uVar11 = Instruction::GetSingleWordOperand(pIVar13,0xc);
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          pIVar16 = analysis::DefUseManager::GetDef
                              ((pIVar2->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar11);
          bVar6 = IsLive(this,pIVar16);
          if (!bVar6) {
            IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar13);
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
              IRContext::BuildDebugInfoManager(pIVar2);
            }
            pIVar16 = analysis::DebugInfoManager::GetDebugInfoNone
                                ((pIVar2->debug_info_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                 ._M_head_impl);
            aVar12._M_elems[0] = '\0';
            aVar12._M_elems[1] = '\0';
            aVar12._M_elems[2] = '\0';
            aVar12._M_elems[3] = '\0';
            if (pIVar16->has_result_id_ == true) {
              aVar12._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
            }
            local_78._0_8_ = &PTR__SmallVector_00930a20;
            local_78._24_8_ = local_78 + 0x10;
            local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_78._16_4_ = aVar12._M_elems;
            local_78._8_8_ = (pointer)0x1;
            pOVar3 = (pIVar13->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pIVar13->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                       -0x5555555555555555) < 0xd) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b8,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar3[0xc].words,(SmallVector<unsigned_int,_2UL> *)local_78);
            local_78._0_8_ = &PTR__SmallVector_00930a20;
            if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_58,local_58._M_head_impl);
            }
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar13);
          }
        }
        else {
          local_78._0_8_ = pIVar13;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&this->to_kill_,(Instruction **)local_78);
          local_88 = true;
        }
      }
      pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar13 != pIVar15);
    pMVar24 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar13 = *(Instruction **)
             ((long)&(pMVar24->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_ + 8);
  pIVar15 = &(pMVar24->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar13 != pIVar15) {
    do {
      bVar6 = IsLive(this,pIVar13);
      if (!bVar6) {
        if (pIVar13->opcode_ == OpTypeForwardPointer) {
          uVar11 = (pIVar13->has_result_id_ & 1) + 1;
          if (pIVar13->has_type_id_ == false) {
            uVar11 = (uint)pIVar13->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(pIVar13,uVar11);
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          pIVar16 = analysis::DefUseManager::GetDef
                              ((pIVar2->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar11);
          bVar6 = IsLive(this,pIVar16);
          if (bVar6) goto LAB_0055c8c0;
        }
        local_78._0_8_ = pIVar13;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&this->to_kill_,(Instruction **)local_78);
        local_88 = true;
      }
LAB_0055c8c0:
      pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar13 != pIVar15);
  }
  if (this->preserve_interface_ == false) {
    pMVar24 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar13 = *(Instruction **)
               ((long)&(pMVar24->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar15 = (Instruction *)
              ((long)&(pMVar24->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar13 != pIVar15) {
      do {
        local_78._0_8_ = (Instruction *)0x0;
        local_78._8_8_ = (pointer)0x0;
        local_78._16_4_ = (array<signed_char,_4UL>)0x0;
        local_78._20_4_ = (array<signed_char,_4UL>)0x0;
        bVar9 = pIVar13->has_type_id_;
        bVar6 = pIVar13->has_result_id_;
        uVar18 = (uint)bVar6;
        uVar20 = (bVar6 & 1) + 1;
        if ((bool)bVar9 == false) {
          uVar20 = (uint)bVar6;
        }
        if (uVar20 != (int)((ulong)((long)(pIVar13->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pIVar13->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555) {
          uVar11 = 0;
          do {
            bVar17 = (byte)uVar18;
            if (uVar11 < 3) {
LAB_0055c9a7:
              __x = Instruction::GetInOperand(pIVar13,uVar11);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_78,__x);
            }
            else {
              pIVar2 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar2);
                bVar9 = pIVar13->has_type_id_;
                bVar17 = pIVar13->has_result_id_;
              }
              pDVar4 = (pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl;
              uVar20 = (bVar17 & 1) + 1;
              if ((bVar9 & 1) == 0) {
                uVar20 = (uint)bVar17;
              }
              id = Instruction::GetSingleWordOperand(pIVar13,uVar20 + uVar11);
              pIVar16 = analysis::DefUseManager::GetDef(pDVar4,id);
              bVar6 = IsLive(this,pIVar16);
              if (bVar6) goto LAB_0055c9a7;
            }
            uVar11 = uVar11 + 1;
            pOVar3 = (pIVar13->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(pIVar13->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3;
            bVar9 = pIVar13->has_type_id_;
            bVar6 = pIVar13->has_result_id_;
            uVar18 = (uint)bVar6;
            uVar20 = (bVar6 & 1) + 1;
            if ((bool)bVar9 == false) {
              uVar20 = (uint)bVar6;
            }
            uVar20 = (int)(uVar14 >> 4) * -0x55555555 - uVar20;
          } while (uVar11 < uVar20);
          if (((long)(local_78._8_8_ - local_78._0_8_) >> 4) * -0x5555555555555555 - (ulong)uVar20
              != 0) {
            uVar20 = (bVar6 & 1) + 1;
            if ((bool)bVar9 == false) {
              uVar20 = uVar18;
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                      (&pIVar13->operands_,
                       (Operand *)
                       ((long)((pOVar3->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar20 * 0x30)
                       ),(Operand *)(uVar14 + (long)pOVar3));
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       &pIVar13->operands_,
                       (pIVar13->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_78._0_8_,local_78._8_8_);
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            analysis::DefUseManager::UpdateDefUse
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,pIVar13);
          }
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_78);
        pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar13 != pIVar15);
    }
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return local_88;
}

Assistant:

bool AggressiveDCEPass::ProcessGlobalValues() {
  // Remove debug and annotation statements referencing dead instructions.
  // This must be done before killing the instructions, otherwise there are
  // dead objects in the def/use database.
  bool modified = false;
  Instruction* instruction = &*get_module()->debug2_begin();
  while (instruction) {
    if (instruction->opcode() != spv::Op::OpName) {
      instruction = instruction->NextNode();
      continue;
    }

    if (IsTargetDead(instruction)) {
      instruction = context()->KillInst(instruction);
      modified = true;
    } else {
      instruction = instruction->NextNode();
    }
  }

  // This code removes all unnecessary decorations safely (see #1174). It also
  // does so in a more efficient manner than deleting them only as the targets
  // are deleted.
  std::vector<Instruction*> annotations;
  for (auto& inst : get_module()->annotations()) annotations.push_back(&inst);
  std::sort(annotations.begin(), annotations.end(), DecorationLess());
  for (auto annotation : annotations) {
    switch (annotation->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpMemberDecorate:
      case spv::Op::OpDecorateStringGOOGLE:
      case spv::Op::OpMemberDecorateStringGOOGLE:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      case spv::Op::OpDecorateId:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        } else {
          if (spv::Decoration(annotation->GetSingleWordInOperand(1)) ==
              spv::Decoration::HlslCounterBufferGOOGLE) {
            // HlslCounterBuffer will reference an id other than the target.
            // If that id is dead, then the decoration can be removed as well.
            uint32_t counter_buffer_id = annotation->GetSingleWordInOperand(2);
            Instruction* counter_buffer_inst =
                get_def_use_mgr()->GetDef(counter_buffer_id);
            if (!IsLive(counter_buffer_inst)) {
              context()->KillInst(annotation);
              modified = true;
            }
          }
        }
        break;
      case spv::Op::OpGroupDecorate: {
        // Go through the targets of this group decorate. Remove each dead
        // target. If all targets are dead, remove this decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i++;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpGroupMemberDecorate: {
        // Go through the targets of this group member decorate. Remove each
        // dead target (and member index). If all targets are dead, remove this
        // decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i + 1);
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i += 2;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpDecorationGroup:
        // By the time we hit decoration groups we've checked everything that
        // can target them. So if they have no uses they must be dead.
        if (get_def_use_mgr()->NumUsers(annotation) == 0) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      default:
        assert(false);
        break;
    }
  }

  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (IsLive(&dbg)) continue;
    // Save GlobalVariable if its variable is live, otherwise null out variable
    // index
    if (dbg.GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
      auto var_id = dbg.GetSingleWordOperand(kGlobalVariableVariableIndex);
      Instruction* var_inst = get_def_use_mgr()->GetDef(var_id);
      if (IsLive(var_inst)) continue;
      context()->ForgetUses(&dbg);
      dbg.SetOperand(
          kGlobalVariableVariableIndex,
          {context()->get_debug_info_mgr()->GetDebugInfoNone()->result_id()});
      context()->AnalyzeUses(&dbg);
      continue;
    }
    to_kill_.push_back(&dbg);
    modified = true;
  }

  // Since ADCE is disabled for non-shaders, we don't check for export linkage
  // attributes here.
  for (auto& val : get_module()->types_values()) {
    if (!IsLive(&val)) {
      // Save forwarded pointer if pointer is live since closure does not mark
      // this live as it does not have a result id. This is a little too
      // conservative since it is not known if the structure type that needed
      // it is still live. TODO(greg-lunarg): Only save if needed.
      if (val.opcode() == spv::Op::OpTypeForwardPointer) {
        uint32_t ptr_ty_id = val.GetSingleWordInOperand(0);
        Instruction* ptr_ty_inst = get_def_use_mgr()->GetDef(ptr_ty_id);
        if (IsLive(ptr_ty_inst)) continue;
      }
      to_kill_.push_back(&val);
      modified = true;
    }
  }

  if (!preserve_interface_) {
    // Remove the dead interface variables from the entry point interface list.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        if (i < 3) {
          // Execution model, function id and name are always valid.
          new_operands.push_back(entry.GetInOperand(i));
        } else {
          auto* var =
              get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
          if (IsLive(var)) {
            new_operands.push_back(entry.GetInOperand(i));
          }
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        get_def_use_mgr()->UpdateDefUse(&entry);
      }
    }
  }

  return modified;
}